

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v11::detail::dragonbox::remove_trailing_zeros(uint64_t *n)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t n32;
  
  uVar3 = *n;
  if (uVar3 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    if (SUB168(auVar1 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar1 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      n32 = (uint32_t)(uVar3 / 100000000);
      iVar2 = remove_trailing_zeros(&n32,8);
      *n = (ulong)n32;
    }
    else {
      iVar2 = 1;
      while( true ) {
        uVar4 = uVar3 * -0x70a3d70a3d70a3d7 >> 2 | uVar3 << 0x3e;
        if (0x28f5c28f5c28f5c < uVar4) break;
        *n = uVar4;
        iVar2 = iVar2 + 2;
        uVar3 = uVar4;
      }
      uVar3 = uVar3 * -0x3333333333333333 >> 1 | uVar3 << 0x3f;
      if (uVar3 < 0x199999999999999a) {
        *n = uVar3;
      }
      else {
        iVar2 = iVar2 + -1;
      }
    }
    return iVar2;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tgsm[P]heliage/dependencies/fmt/include/fmt/format-inl.h"
              ,0x48c,"");
}

Assistant:

FMT_INLINE int remove_trailing_zeros(uint64_t& n) noexcept {
  FMT_ASSERT(n != 0, "");

  // This magic number is ceil(2^90 / 10^8).
  constexpr uint64_t magic_number = 12379400392853802749ull;
  auto nm = umul128(n, magic_number);

  // Is n is divisible by 10^8?
  if ((nm.high() & ((1ull << (90 - 64)) - 1)) == 0 && nm.low() < magic_number) {
    // If yes, work with the quotient...
    auto n32 = static_cast<uint32_t>(nm.high() >> (90 - 64));
    // ... and use the 32 bit variant of the function
    int s = remove_trailing_zeros(n32, 8);
    n = n32;
    return s;
  }

  // If n is not divisible by 10^8, work with n itself.
  constexpr uint64_t mod_inv_5 = 0xcccccccccccccccd;
  constexpr uint64_t mod_inv_25 = 0x8f5c28f5c28f5c29;  // mod_inv_5 * mod_inv_5

  int s = 0;
  while (true) {
    auto q = rotr(n * mod_inv_25, 2);
    if (q > max_value<uint64_t>() / 100) break;
    n = q;
    s += 2;
  }
  auto q = rotr(n * mod_inv_5, 1);
  if (q <= max_value<uint64_t>() / 10) {
    n = q;
    s |= 1;
  }

  return s;
}